

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O0

bool __thiscall ast::Value::evaluate(Value *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  string local_38;
  Value *local_18;
  Value *this_local;
  
  uVar1 = (this->super_Expression).value;
  if ((int)uVar1 < 1) {
    uVar1 = -uVar1;
  }
  local_18 = this;
  uVar2 = mask(0x10,0);
  bVar3 = (uVar1 & (uVar2 ^ 0xffffffff)) == 0;
  if (!bVar3) {
    uVar1 = (this->super_Expression).value;
    string_printf_abi_cxx11_
              (&local_38,"value = %d (0x%x) not encodable in a %d bit word",(ulong)uVar1,
               (ulong)uVar1,0x10);
    warning_report(&(this->super_Expression).location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return bVar3;
}

Assistant:

bool Value::evaluate()
{
	if ((abs(value ) & ~mask(16, 0)) != 0) {
		warning_report(&location, string_printf("value = %d (0x%x) not encodable in a %d bit word",
				value, value, 16));
		return false;
	}
	return true;
}